

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

void * p2sc_get_symbol(char *path,char **name,void **addr)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  
  iVar1 = g_module_supported();
  if (iVar1 == 0) {
    pcVar3 = "Dynamic loading of modules not supported";
    iVar1 = 0xe6;
  }
  else {
    pvVar2 = (void *)g_module_open(path,3);
    if (pvVar2 == (void *)0x0) {
      g_module_error();
      pcVar3 = "%s";
      iVar1 = 0xec;
    }
    else {
      do {
        pcVar3 = *name;
        if (pcVar3 == (char *)0x0) {
          return pvVar2;
        }
        name = name + 1;
        iVar1 = g_module_symbol(pvVar2,pcVar3,addr);
        addr = addr + 1;
      } while (iVar1 != 0);
      g_module_error();
      pcVar3 = "%s";
      iVar1 = 0xf0;
    }
  }
  _p2sc_msg("p2sc_get_symbol",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,iVar1,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,pcVar3);
  exit(1);
}

Assistant:

void *p2sc_get_symbol(const char *path, const char **name, void **addr) {
    if (!g_module_supported())
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "Dynamic loading of modules not supported");

    GModule *module = g_module_open(path,
                                    (GModuleFlags) (G_MODULE_BIND_LAZY | G_MODULE_BIND_LOCAL));

    if (!module)
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s", g_module_error());

    while (*name)
        if (!g_module_symbol(module, *name++, addr++))
            P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s", g_module_error());

    return module;
}